

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

void SetErrorMessage(ScriptContext *scriptContext,JavascriptError *newError,JsValueRef message)

{
  bool bVar1;
  BOOL BVar2;
  JavascriptString *value;
  undefined1 local_50 [8];
  PropertyDescriptor desc;
  
  BVar2 = Js::JavascriptOperators::IsUndefined(message);
  if (BVar2 == 0) {
    bVar1 = Js::VarIs<Js::JavascriptString>(message);
    if (bVar1) {
      value = Js::VarTo<Js::JavascriptString>(message);
    }
    else {
      value = Js::JavascriptConversion::ToString(message,scriptContext);
    }
    Js::PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_50);
    Js::PropertyDescriptor::SetValue((PropertyDescriptor *)local_50,value);
    Js::PropertyDescriptor::SetWritable((PropertyDescriptor *)local_50,true);
    Js::PropertyDescriptor::SetEnumerable((PropertyDescriptor *)local_50,false);
    Js::PropertyDescriptor::SetConfigurable((PropertyDescriptor *)local_50,true);
    Js::JavascriptOperators::SetPropertyDescriptor
              ((RecyclableObject *)newError,0x102,(PropertyDescriptor *)local_50);
  }
  return;
}

Assistant:

void SetErrorMessage(Js::ScriptContext *scriptContext, Js::JavascriptError *newError, JsValueRef message)
{
    // ECMA262 #sec-error-message
    if (!Js::JavascriptOperators::IsUndefined(message))
    {
        Js::JavascriptString *messageStr = nullptr;
        if (Js::VarIs<Js::JavascriptString>(message))
        {
            messageStr = Js::VarTo<Js::JavascriptString>(message);
        }
        else
        {
            messageStr = Js::JavascriptConversion::ToString(message, scriptContext);
        }

        Js::PropertyDescriptor desc;
        desc.SetValue(messageStr);
        desc.SetWritable(true);
        desc.SetEnumerable(false);
        desc.SetConfigurable(true);
        Js::JavascriptOperators::SetPropertyDescriptor(newError, Js::PropertyIds::message, desc);
    }
}